

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ActionBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ActionBlockSyntax,slang::syntax::StatementSyntax*&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,StatementSyntax **args,ElseClauseSyntax **args_1)

{
  ActionBlockSyntax *this_00;
  
  this_00 = (ActionBlockSyntax *)allocate(this,0x28,8);
  slang::syntax::ActionBlockSyntax::ActionBlockSyntax(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }